

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biasmultiply.cc
# Opt level: O0

duration<double,_std::ratio<1L,_1L>_>
testOld<intgemm::AVX2::Kernels8>(Index A_rows,Index width,Index B_cols)

{
  UnquantizeAndAddBiasAndWrite callback;
  float unquant_mult_00;
  float *bias_addr;
  float *output_addr;
  type this;
  result_type_conflict rVar1;
  time_point end;
  time_point start;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<signed_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end1_2;
  float *__begin1_2;
  AlignedVector<float> *__range1_2;
  float *it_1;
  float *__end1_1;
  float *__begin1_1;
  AlignedVector<float> *__range1_1;
  float *it;
  float *__end1;
  float *__begin1;
  AlignedVector<float> *__range1;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffead8;
  Index cols;
  Index in_stack_ffffffffffffeae0;
  undefined4 uVar2;
  float in_stack_ffffffffffffeae4;
  undefined4 uVar3;
  int8_t *in_stack_ffffffffffffeae8;
  AlignedVector<float> *in_stack_ffffffffffffeaf0;
  UnquantizeAndAddBiasAndWrite local_14a8;
  undefined8 local_1490;
  AlignedVector<float> local_1488;
  AlignedVector<signed_char> local_1478;
  AlignedVector<signed_char> local_1468;
  float local_1454;
  undefined4 local_1450;
  undefined4 local_144c;
  float *local_1448;
  float *local_1440;
  float *local_1438;
  AlignedVector<float> *local_1430;
  float *local_1428;
  float *local_1420;
  float *local_1418;
  AlignedVector<float> *local_1410;
  float *local_1408;
  float *local_1400;
  float *local_13f8;
  AlignedVector<float> *local_13f0;
  Index in_stack_ffffffffffffec44;
  Index in_stack_ffffffffffffec48;
  float in_stack_ffffffffffffec4c;
  int8_t *in_stack_ffffffffffffec50;
  float *in_stack_ffffffffffffec58;
  Index in_stack_fffffffffffff634;
  Index in_stack_fffffffffffff638;
  Index in_stack_fffffffffffff63c;
  int8_t *in_stack_fffffffffffff640;
  int8_t *in_stack_fffffffffffff648;
  AlignedVector<float> local_58 [2];
  AlignedVector<float> local_38;
  AlignedVector<float> local_28 [2];
  rep_conflict local_8;
  
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaf0,(size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaf0,(size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaf0,(size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x10a507);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),
             (float)((ulong)in_stack_ffffffffffffead8 >> 0x20),SUB84(in_stack_ffffffffffffead8,0));
  local_13f0 = local_28;
  local_13f8 = intgemm::AlignedVector<float>::begin(local_13f0);
  local_1400 = intgemm::AlignedVector<float>::end(local_13f0);
  for (; local_13f8 != local_1400; local_13f8 = local_13f8 + 1) {
    local_1408 = local_13f8;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),
                       in_stack_ffffffffffffead8);
    *local_1408 = rVar1;
  }
  local_1410 = &local_38;
  local_1418 = intgemm::AlignedVector<float>::begin(local_1410);
  local_1420 = intgemm::AlignedVector<float>::end(local_1410);
  for (; local_1418 != local_1420; local_1418 = local_1418 + 1) {
    local_1428 = local_1418;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),
                       in_stack_ffffffffffffead8);
    *local_1428 = rVar1;
  }
  local_1430 = local_58;
  local_1438 = intgemm::AlignedVector<float>::begin(local_1430);
  local_1440 = intgemm::AlignedVector<float>::end(local_1430);
  for (; local_1438 != local_1440; local_1438 = local_1438 + 1) {
    local_1448 = local_1438;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0),
                       in_stack_ffffffffffffead8);
    *local_1448 = rVar1;
  }
  local_144c = 0x40000000;
  local_1450 = 0x427e0000;
  local_1454 = 0.0002480005;
  intgemm::AlignedVector<float>::size(local_28);
  cols = (Index)((ulong)in_stack_ffffffffffffead8 >> 0x20);
  intgemm::AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffeaf0,
             (size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  intgemm::AlignedVector<float>::size(&local_38);
  intgemm::AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffeaf0,
             (size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  intgemm::AlignedVector<float>::begin(local_28);
  intgemm::AlignedVector<signed_char>::begin(&local_1468);
  intgemm::AVX2::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae4,
             in_stack_ffffffffffffeae0,cols);
  intgemm::AlignedVector<float>::begin(&local_38);
  intgemm::AlignedVector<signed_char>::begin(&local_1478);
  intgemm::AVX2::Kernels8::PrepareB
            (in_stack_ffffffffffffec58,in_stack_ffffffffffffec50,in_stack_ffffffffffffec4c,
             in_stack_ffffffffffffec48,in_stack_ffffffffffffec44);
  intgemm::AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffeaf0,(size_t)in_stack_ffffffffffffeae8,
             CONCAT44(in_stack_ffffffffffffeae4,in_stack_ffffffffffffeae0));
  local_1490 = std::chrono::_V2::system_clock::now();
  intgemm::AlignedVector<signed_char>::begin(&local_1468);
  intgemm::AlignedVector<signed_char>::begin(&local_1478);
  unquant_mult_00 = local_1454;
  bias_addr = intgemm::AlignedVector<float>::begin(local_58);
  output_addr = intgemm::AlignedVector<float>::begin(&local_1488);
  intgemm::callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_14a8,unquant_mult_00,bias_addr,output_addr);
  uVar2 = SUB84(local_14a8.bias_addr,0);
  uVar3 = (undefined4)((ulong)local_14a8.bias_addr >> 0x20);
  callback.bias_addr = local_14a8.output_addr;
  callback._0_8_ = local_14a8.bias_addr;
  callback.output_addr = (float *)in_stack_ffffffffffffeaf0;
  intgemm::AVX2::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
             in_stack_fffffffffffff638,in_stack_fffffffffffff634,callback);
  std::chrono::_V2::system_clock::now();
  this = std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)local_14a8.output_addr,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT44(uVar3,uVar2));
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)local_14a8.output_addr);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10a9c1);
  intgemm::AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x10a9ce);
  intgemm::AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x10a9db);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10a9e8);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10a9f5);
  intgemm::AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x10aa02);
  return (duration<double,_std::ratio<1L,_1L>_>)local_8;
}

Assistant:

std::chrono::duration<double> testOld(Index A_rows, Index width, Index B_cols) {
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<int8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  auto start = std::chrono::system_clock::now();
  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));
  auto end = std::chrono::system_clock::now();

  std::chrono::duration<double> elapsed_seconds = end-start;
  return elapsed_seconds;

}